

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::Skip(TestSuite *this)

{
  int iVar1;
  UnitTestImpl *this_00;
  TestEventListeners *this_01;
  TestEventListener *pTVar2;
  TestSuite *in_RDI;
  int i;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  TestInfo *in_stack_00000070;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  int iVar4;
  
  if ((in_RDI->should_run_ & 1U) != 0) {
    this_00 = internal::GetUnitTestImpl();
    internal::UnitTestImpl::set_current_test_suite(this_00,in_RDI);
    UnitTest::GetInstance();
    this_01 = UnitTest::listeners((UnitTest *)0x154454);
    pTVar2 = TestEventListeners::repeater(this_01);
    (*pTVar2->_vptr_TestEventListener[6])(pTVar2,in_RDI);
    (*pTVar2->_vptr_TestEventListener[7])(pTVar2,in_RDI);
    iVar3 = 0;
    while (iVar4 = iVar3, iVar1 = total_test_count((TestSuite *)0x15449b), iVar3 < iVar1) {
      GetMutableTestInfo((TestSuite *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                         (int)((ulong)in_RDI >> 0x20));
      TestInfo::Skip(in_stack_00000070);
      iVar3 = iVar4 + 1;
    }
    (*pTVar2->_vptr_TestEventListener[0xc])(pTVar2,in_RDI);
    (*pTVar2->_vptr_TestEventListener[0xd])(pTVar2,in_RDI);
    internal::UnitTestImpl::set_current_test_suite(this_00,(TestSuite *)0x0);
  }
  return;
}

Assistant:

void TestSuite::Skip() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Skip();
  }

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
  // Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->set_current_test_suite(nullptr);
}